

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

uint8 * load_jpeg_image(jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  anon_struct_72_14_dbcb52e3 *paVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint8 *puVar12;
  code *pcVar13;
  uint8 *puVar14;
  int iVar15;
  ulong uVar16;
  code *pcVar17;
  uint uVar18;
  int *piVar19;
  ulong uVar20;
  anon_struct_72_14_dbcb52e3 *paVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int id;
  long lVar26;
  int *piVar27;
  int local_178;
  uint8 *coutput [4];
  short data [64];
  
  if (4 < (uint)req_comp) {
    failure_reason = "Internal error";
    return (uint8 *)0x0;
  }
  (z->s).img_n = 0;
  z->restart_interval = 0;
  iVar7 = decode_jpeg_header(z,0);
  if (iVar7 == 0) {
LAB_00159194:
    cleanup_jpeg(z);
    return (uint8 *)0x0;
  }
  bVar6 = get_marker(z);
  paVar1 = z->img_comp;
LAB_00158d76:
  if (bVar6 != 0xda) {
    if (bVar6 != 0xd9) {
      iVar7 = process_marker(z,(uint)bVar6);
      goto LAB_00158d91;
    }
    uVar25 = (z->s).img_n;
    if (req_comp == 0) {
      req_comp = uVar25;
    }
    lVar26 = 0;
    uVar16 = 0;
    if (0 < (int)uVar25) {
      uVar16 = (ulong)uVar25;
    }
    uVar20 = 1;
    if (2 < req_comp) {
      uVar20 = uVar16;
    }
    if (uVar25 != 3) {
      uVar20 = uVar16;
    }
    piVar19 = &z->img_comp[0].h;
    goto LAB_00159200;
  }
  iVar10 = get16(&z->s);
  iVar7 = get8(&z->s);
  z->scan_n = iVar7;
  if (((0xfffffffb < iVar7 - 5U) && (iVar7 <= (z->s).img_n)) && (iVar10 == iVar7 * 2 + 6)) {
    for (lVar26 = 0; iVar10 = get8(&z->s), lVar26 < iVar7; lVar26 = lVar26 + 1) {
      uVar8 = get8(&z->s);
      uVar25 = (z->s).img_n;
      uVar16 = 0;
      if (0 < (int)uVar25) {
        uVar16 = (ulong)uVar25;
      }
      paVar21 = paVar1;
      for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
        if (paVar21->id == iVar10) {
          uVar16 = uVar20 & 0xffffffff;
          break;
        }
        paVar21 = paVar21 + 1;
      }
      if ((uint)uVar16 == uVar25) goto LAB_00159194;
      z->img_comp[uVar16].hd = (int)uVar8 >> 4;
      if ((3 < (int)uVar8 >> 4) || (paVar1[uVar16].ha = uVar8 & 0xf, 3 < (uVar8 & 0xf)))
      goto LAB_00159186;
      z->order[lVar26] = (uint)uVar16;
      iVar7 = z->scan_n;
    }
    if (iVar10 != 0) goto LAB_00159186;
    get8(&z->s);
    iVar7 = get8(&z->s);
    if (iVar7 != 0) goto LAB_00159186;
    reset(z);
    if (z->scan_n == 1) {
      iVar7 = z->order[0];
      uVar25 = z->img_comp[iVar7].x + 7 >> 3;
      iVar10 = z->img_comp[iVar7].y + 7 >> 3;
      if ((int)uVar25 < 1) {
        uVar25 = 0;
      }
      local_178 = 0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      for (iVar15 = 0; iVar15 != iVar10; iVar15 = iVar15 + 1) {
        for (lVar26 = 0; (ulong)uVar25 * 8 != lVar26; lVar26 = lVar26 + 8) {
          iVar11 = decode_block(z,data,z->huff_dc + paVar1[iVar7].hd,z->huff_ac + paVar1[iVar7].ha,
                                iVar7);
          if (iVar11 == 0) goto LAB_00159161;
          idct_block(paVar1[iVar7].data + lVar26 + local_178 * paVar1[iVar7].w2,paVar1[iVar7].w2,
                     data,z->dequant[paVar1[iVar7].tq]);
          iVar11 = z->todo;
          z->todo = iVar11 + -1;
          if (iVar11 < 2) {
            if (z->code_bits < 0x18) {
              grow_buffer_unsafe(z);
            }
            if ((z->marker & 0xf8) != 0xd0) goto LAB_00159172;
            reset(z);
          }
        }
        local_178 = local_178 + 8;
      }
    }
    else {
      for (iVar7 = 0; iVar7 < z->img_mcu_y; iVar7 = iVar7 + 1) {
        for (iVar10 = 0; iVar10 < z->img_mcu_x; iVar10 = iVar10 + 1) {
          for (lVar26 = 0; lVar26 < z->scan_n; lVar26 = lVar26 + 1) {
            iVar15 = z->order[lVar26];
            for (iVar11 = 0; iVar11 < paVar1[iVar15].v; iVar11 = iVar11 + 1) {
              for (iVar23 = 0; iVar3 = paVar1[iVar15].h, iVar23 < iVar3; iVar23 = iVar23 + 1) {
                iVar4 = paVar1[iVar15].v;
                iVar9 = decode_block(z,data,z->huff_dc + paVar1[iVar15].hd,
                                     z->huff_ac + paVar1[iVar15].ha,iVar15);
                if (iVar9 == 0) goto LAB_00159161;
                idct_block(paVar1[iVar15].data +
                           (long)((iVar3 * iVar10 + iVar23) * 8) +
                           (long)((iVar4 * iVar7 + iVar11) * paVar1[iVar15].w2 * 8),
                           paVar1[iVar15].w2,data,z->dequant[paVar1[iVar15].tq]);
              }
            }
          }
          iVar15 = z->todo;
          z->todo = iVar15 + -1;
          if (iVar15 < 2) {
            if (z->code_bits < 0x18) {
              grow_buffer_unsafe(z);
            }
            if ((z->marker & 0xf8) != 0xd0) goto LAB_00159172;
            reset(z);
          }
        }
      }
    }
    goto LAB_00158d99;
  }
LAB_00159186:
  failure_reason = "Corrupt JPEG";
  goto LAB_00159194;
LAB_00159200:
  if (uVar20 * 0x30 - lVar26 == 0) {
    uVar25 = (z->s).img_x;
    uVar8 = (z->s).img_y;
    puVar12 = (uint8 *)malloc((ulong)(uVar25 * req_comp * uVar8 + 1));
    if (puVar12 != (uint8 *)0x0) {
      iVar7 = 0;
      for (uVar18 = 0; uVar18 < uVar8; uVar18 = uVar18 + 1) {
        piVar19 = (int *)(data + 0x14);
        piVar27 = &z->img_comp[0].y;
        for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
          iVar10 = piVar19[-1];
          iVar15 = piVar19[-3];
          iVar11 = iVar15 >> 1;
          puVar14 = (uint8 *)(**(code **)(piVar19 + -10))
                                       (*(uint8 **)(piVar27 + 8),
                                        *(undefined8 *)
                                         ((long)piVar19 +
                                         ((ulong)(iVar11 <= iVar10) << 3 | 0xffffffffffffffe0)),
                                        *(undefined8 *)
                                         ((long)piVar19 +
                                         ((ulong)(iVar10 < iVar11) << 3 | 0xffffffffffffffe0)),
                                        piVar19[-2]);
          coutput[uVar16] = puVar14;
          piVar19[-1] = iVar10 + 1;
          if (iVar15 <= iVar10 + 1) {
            piVar19[-1] = 0;
            *(long *)(piVar19 + -8) = *(long *)(piVar19 + -6);
            iVar10 = *piVar19;
            *piVar19 = iVar10 + 1;
            if (iVar10 + 1 < *piVar27) {
              *(long *)(piVar19 + -6) = *(long *)(piVar19 + -6) + (long)piVar27[1];
            }
          }
          piVar27 = piVar27 + 0x12;
          piVar19 = piVar19 + 0xc;
        }
        if (req_comp < 3) {
          uVar8 = (z->s).img_x;
          if (req_comp == 1) {
            uVar24 = uVar25 * iVar7;
            for (uVar16 = 0; uVar25 = uVar8, uVar8 != uVar16; uVar16 = uVar16 + 1) {
              puVar12[uVar16 + uVar24] = coutput[0][uVar16];
            }
          }
          else {
            uVar24 = uVar25 * iVar7;
            for (uVar16 = 0; uVar25 = uVar8, uVar8 != uVar16; uVar16 = uVar16 + 1) {
              puVar12[uVar16 * 2 + (ulong)uVar24] = coutput[0][uVar16];
              puVar12[uVar16 * 2 + (ulong)uVar24 + 1] = 0xff;
            }
          }
        }
        else if ((z->s).img_n == 3) {
          uVar8 = (z->s).img_x;
          uVar16 = 0;
          if (0 < (int)uVar8) {
            uVar16 = (ulong)uVar8;
          }
          puVar14 = puVar12 + (ulong)(uVar25 * iVar7) + 3;
          for (uVar22 = 0; uVar25 = uVar8, uVar16 != uVar22; uVar22 = uVar22 + 1) {
            iVar15 = (uint)coutput[0][uVar22] * 0x10000;
            iVar10 = (int)((coutput[2][uVar22] - 0x80) * 0x166e9 + iVar15 + 0x8000) >> 0x10;
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            iVar11 = (coutput[1][uVar22] - 0x80) * -0x581a +
                     (coutput[2][uVar22] - 0x80) * -0xb6d2 + iVar15 + 0x8000;
            if (iVar11 >> 0x10 < 1) {
              iVar11 = 0;
            }
            iVar11 = iVar11 >> 0x10;
            if (0xfe < iVar11) {
              iVar11 = 0xff;
            }
            iVar23 = (int)(iVar15 + (coutput[1][uVar22] - 0x80) * 0x1c5a2 + 0x8000) >> 0x10;
            iVar15 = 0;
            if (0 < iVar23) {
              iVar15 = iVar23;
            }
            if (0xfe < iVar15) {
              iVar15 = 0xff;
            }
            puVar14[-3] = (uint8)iVar10;
            puVar14[-2] = (uint8)iVar11;
            puVar14[-1] = (uint8)iVar15;
            *puVar14 = 0xff;
            puVar14 = puVar14 + (uint)req_comp;
          }
        }
        else {
          uVar8 = (z->s).img_x;
          puVar14 = puVar12 + (ulong)(uVar25 * iVar7) + 3;
          for (uVar16 = 0; uVar25 = uVar8, uVar8 != uVar16; uVar16 = uVar16 + 1) {
            uVar2 = coutput[0][uVar16];
            puVar14[-1] = uVar2;
            puVar14[-2] = uVar2;
            puVar14[-3] = uVar2;
            *puVar14 = 0xff;
            puVar14 = puVar14 + (uint)req_comp;
          }
        }
        uVar8 = (z->s).img_y;
        iVar7 = iVar7 + req_comp;
      }
      cleanup_jpeg(z);
      *out_x = (z->s).img_x;
      *out_y = (z->s).img_y;
      if (comp != (int *)0x0) {
        *comp = (z->s).img_n;
        return puVar12;
      }
      return puVar12;
    }
LAB_001595e4:
    cleanup_jpeg(z);
    failure_reason = "Out of memory";
    return (uint8 *)0x0;
  }
  uVar5 = (z->s).img_x;
  puVar12 = (uint8 *)malloc((ulong)(uVar5 + 3));
  *(uint8 **)(piVar19 + 0xf) = puVar12;
  if (puVar12 == (uint8 *)0x0) goto LAB_001595e4;
  uVar16 = (long)z->img_h_max / (long)*piVar19;
  iVar7 = (int)uVar16;
  *(int *)((long)data + lVar26 + 0x18) = iVar7;
  iVar10 = z->img_v_max / piVar19[1];
  *(int *)((long)data + lVar26 + 0x1c) = iVar10;
  *(int *)((long)data + lVar26 + 0x24) = iVar10 >> 1;
  *(int *)((long)data + lVar26 + 0x20) = (int)((ulong)((uVar5 + iVar7) - 1) / (uVar16 & 0xffffffff))
  ;
  *(undefined4 *)((long)data + lVar26 + 0x28) = 0;
  puVar12 = *(uint8 **)(piVar19 + 0xb);
  *(uint8 **)((long)data + lVar26 + 0x10) = puVar12;
  *(uint8 **)((long)data + lVar26 + 8) = puVar12;
  if (iVar7 == 2) {
    pcVar13 = resample_row_generic;
    if (iVar10 == 2) {
      pcVar13 = resample_row_hv_2;
    }
    pcVar17 = resample_row_h_2;
LAB_001592ca:
    if (iVar10 == 1) {
      pcVar13 = pcVar17;
    }
  }
  else {
    pcVar13 = resample_row_generic;
    if (iVar7 == 1) {
      pcVar13 = resample_row_generic;
      if (iVar10 == 2) {
        pcVar13 = resample_row_v_2;
      }
      pcVar17 = resample_row_1;
      goto LAB_001592ca;
    }
  }
  *(code **)((long)data + lVar26) = pcVar13;
  lVar26 = lVar26 + 0x30;
  piVar19 = piVar19 + 0x12;
  goto LAB_00159200;
LAB_00159161:
  iVar7 = 0;
  goto LAB_00158d91;
LAB_00159172:
  iVar7 = 1;
LAB_00158d91:
  if (iVar7 == 0) goto LAB_00159194;
LAB_00158d99:
  bVar6 = get_marker(z);
  goto LAB_00158d76;
}

Assistant:

static uint8 *load_jpeg_image(jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n;
   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   z->s.img_n = 0;

   // load a jpeg image from whichever source
   if (!decode_jpeg_image(z)) { cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s.img_n;

   if (z->s.img_n == 3 && n < 3)
      decode_n = 1;
   else
      decode_n = z->s.img_n;

   // resample and color-convert
   {
      int k;
      uint i,j;
      uint8 *output;
      uint8 *coutput[4];

      stbi_resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi_resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (uint8 *) malloc(z->s.img_x + 3);
         if (!z->img_comp[k].linebuf) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s.img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = resample_row_hv_2;
         else                               r->resample = resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (uint8 *) malloc(n * z->s.img_x * z->s.img_y + 1);
      if (!output) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s.img_y; ++j) {
         uint8 *out = output + n * z->s.img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi_resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            uint8 *y = coutput[0];
            if (z->s.img_n == 3) {
               #if STBI_SIMD
               stbi_YCbCr_installed(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #else
               YCbCr_to_RGB_row(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #endif
            } else
               for (i=0; i < z->s.img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            uint8 *y = coutput[0];
            if (n == 1)
               for (i=0; i < z->s.img_x; ++i) out[i] = y[i];
            else
               for (i=0; i < z->s.img_x; ++i) *out++ = y[i], *out++ = 255;
         }
      }
      cleanup_jpeg(z);
      *out_x = z->s.img_x;
      *out_y = z->s.img_y;
      if (comp) *comp  = z->s.img_n; // report original components, not output
      return output;
   }
}